

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O0

block * gen_mtp2type_abbrev(compiler_state_t *cstate,int type)

{
  block *pbVar1;
  block *b1;
  block *b0;
  int type_local;
  compiler_state_t *cstate_local;
  
  switch(type) {
  case 0x16:
    if (((cstate->linktype != 0x8c) && (cstate->linktype != 0xc5)) && (cstate->linktype != 0x8b)) {
      bpf_error(cstate,"\'fisu\' supported only on MTP2");
    }
    b1 = gen_ncmp(cstate,OR_PACKET,cstate->off_li,0x10,0x3f,0x10,0,0);
    break;
  case 0x17:
    if (((cstate->linktype != 0x8c) && (cstate->linktype != 0xc5)) && (cstate->linktype != 0x8b)) {
      bpf_error(cstate,"\'lssu\' supported only on MTP2");
    }
    b1 = gen_ncmp(cstate,OR_PACKET,cstate->off_li,0x10,0x3f,0x20,1,2);
    pbVar1 = gen_ncmp(cstate,OR_PACKET,cstate->off_li,0x10,0x3f,0x20,0,0);
    gen_and(pbVar1,b1);
    break;
  case 0x18:
    if (((cstate->linktype != 0x8c) && (cstate->linktype != 0xc5)) && (cstate->linktype != 0x8b)) {
      bpf_error(cstate,"\'msu\' supported only on MTP2");
    }
    b1 = gen_ncmp(cstate,OR_PACKET,cstate->off_li,0x10,0x3f,0x20,0,2);
    break;
  case 0x19:
    if (((cstate->linktype != 0x8c) && (cstate->linktype != 0xc5)) && (cstate->linktype != 0x8b)) {
      bpf_error(cstate,"\'hfisu\' supported only on MTP2_HSL");
    }
    b1 = gen_ncmp(cstate,OR_PACKET,cstate->off_li_hsl,8,0xff80,0x10,0,0);
    break;
  case 0x1a:
    if (((cstate->linktype != 0x8c) && (cstate->linktype != 0xc5)) && (cstate->linktype != 0x8b)) {
      bpf_error(cstate,"\'hlssu\' supported only on MTP2_HSL");
    }
    b1 = gen_ncmp(cstate,OR_PACKET,cstate->off_li_hsl,8,0xff80,0x20,1,0x100);
    pbVar1 = gen_ncmp(cstate,OR_PACKET,cstate->off_li_hsl,8,0xff80,0x20,0,0);
    gen_and(pbVar1,b1);
    break;
  case 0x1b:
    if (((cstate->linktype != 0x8c) && (cstate->linktype != 0xc5)) && (cstate->linktype != 0x8b)) {
      bpf_error(cstate,"\'hmsu\' supported only on MTP2_HSL");
    }
    b1 = gen_ncmp(cstate,OR_PACKET,cstate->off_li_hsl,8,0xff80,0x20,0,0x100);
    break;
  default:
    abort();
  }
  return b1;
}

Assistant:

struct block *
gen_mtp2type_abbrev(compiler_state_t *cstate, int type)
{
	struct block *b0, *b1;

	switch (type) {

	case M_FISU:
		if ( (cstate->linktype != DLT_MTP2) &&
		     (cstate->linktype != DLT_ERF) &&
		     (cstate->linktype != DLT_MTP2_WITH_PHDR) )
			bpf_error(cstate, "'fisu' supported only on MTP2");
		/* gen_ncmp(cstate, offrel, offset, size, mask, jtype, reverse, value) */
		b0 = gen_ncmp(cstate, OR_PACKET, cstate->off_li, BPF_B, 0x3f, BPF_JEQ, 0, 0);
		break;

	case M_LSSU:
		if ( (cstate->linktype != DLT_MTP2) &&
		     (cstate->linktype != DLT_ERF) &&
		     (cstate->linktype != DLT_MTP2_WITH_PHDR) )
			bpf_error(cstate, "'lssu' supported only on MTP2");
		b0 = gen_ncmp(cstate, OR_PACKET, cstate->off_li, BPF_B, 0x3f, BPF_JGT, 1, 2);
		b1 = gen_ncmp(cstate, OR_PACKET, cstate->off_li, BPF_B, 0x3f, BPF_JGT, 0, 0);
		gen_and(b1, b0);
		break;

	case M_MSU:
		if ( (cstate->linktype != DLT_MTP2) &&
		     (cstate->linktype != DLT_ERF) &&
		     (cstate->linktype != DLT_MTP2_WITH_PHDR) )
			bpf_error(cstate, "'msu' supported only on MTP2");
		b0 = gen_ncmp(cstate, OR_PACKET, cstate->off_li, BPF_B, 0x3f, BPF_JGT, 0, 2);
		break;

	case MH_FISU:
		if ( (cstate->linktype != DLT_MTP2) &&
		     (cstate->linktype != DLT_ERF) &&
		     (cstate->linktype != DLT_MTP2_WITH_PHDR) )
			bpf_error(cstate, "'hfisu' supported only on MTP2_HSL");
		/* gen_ncmp(cstate, offrel, offset, size, mask, jtype, reverse, value) */
		b0 = gen_ncmp(cstate, OR_PACKET, cstate->off_li_hsl, BPF_H, 0xff80, BPF_JEQ, 0, 0);
		break;

	case MH_LSSU:
		if ( (cstate->linktype != DLT_MTP2) &&
		     (cstate->linktype != DLT_ERF) &&
		     (cstate->linktype != DLT_MTP2_WITH_PHDR) )
			bpf_error(cstate, "'hlssu' supported only on MTP2_HSL");
		b0 = gen_ncmp(cstate, OR_PACKET, cstate->off_li_hsl, BPF_H, 0xff80, BPF_JGT, 1, 0x0100);
		b1 = gen_ncmp(cstate, OR_PACKET, cstate->off_li_hsl, BPF_H, 0xff80, BPF_JGT, 0, 0);
		gen_and(b1, b0);
		break;

	case MH_MSU:
		if ( (cstate->linktype != DLT_MTP2) &&
		     (cstate->linktype != DLT_ERF) &&
		     (cstate->linktype != DLT_MTP2_WITH_PHDR) )
			bpf_error(cstate, "'hmsu' supported only on MTP2_HSL");
		b0 = gen_ncmp(cstate, OR_PACKET, cstate->off_li_hsl, BPF_H, 0xff80, BPF_JGT, 0, 0x0100);
		break;

	default:
		abort();
	}
	return b0;
}